

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

void testJsonParseError(void)

{
  runtime_error *error_1;
  runtime_error *error;
  allocator<char> local_131;
  string local_130;
  undefined1 local_110 [8];
  JsonParser numberParser;
  allocator<char> local_91;
  string local_90;
  undefined1 local_70 [8];
  JsonParser trueParser;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90," true xx",&local_91);
  crawler::JsonParser::JsonParser((JsonParser *)local_70,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator(&local_91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_130," 0 12",&local_131);
  crawler::JsonParser::JsonParser((JsonParser *)local_110,&local_130);
  std::__cxx11::string::~string((string *)&local_130);
  std::allocator<char>::~allocator(&local_131);
  crawler::JsonParser::parse((JsonValue *)&error,(JsonParser *)local_70);
  crawler::JsonValue::~JsonValue((JsonValue *)&error);
  test_count = test_count + 1;
  fprintf(_stderr,"function %s(): %s:%d  Assertion `%s` failed. expect: %d actual: %d\n",
          "testJsonParseError",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/ramsayleung[P]crawler/test.cpp",
          0x197,"true == (0)",1,0);
  main_ret = 1;
  crawler::JsonParser::parse((JsonValue *)&error_1,(JsonParser *)local_110);
  crawler::JsonValue::~JsonValue((JsonValue *)&error_1);
  test_count = test_count + 1;
  fprintf(_stderr,"function %s(): %s:%d  Assertion `%s` failed. expect: %d actual: %d\n",
          "testJsonParseError",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/ramsayleung[P]crawler/test.cpp",
          0x19d,"true == (0)",1,0);
  main_ret = 1;
  crawler::JsonParser::~JsonParser((JsonParser *)local_110);
  crawler::JsonParser::~JsonParser((JsonParser *)local_70);
  return;
}

Assistant:

void testJsonParseError() {
  crawler::JsonParser trueParser(" true xx");
  crawler::JsonParser numberParser(" 0 12");
  try {
    trueParser.parse();

    // it should be unreachable, otherwise, it should failed.
    ASSERT_TRUE(0);
  } catch (const std::runtime_error &error) {
    ASSERT_CSTRING_EQ("PARSE_ROOT_NOT_SINGULAR", error.what());
  }
  try {
    numberParser.parse();
    ASSERT_TRUE(0);
  } catch (const std::runtime_error &error) {
    ASSERT_CSTRING_EQ("PARSE_ROOT_NOT_SINGULAR", error.what());
  }
}